

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::SplineLoader::begin__input____InputLocal
          (SplineLoader *this,input____InputLocal__AttributeData *attributeData)

{
  InputUnshared *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  String local_58;
  String local_38;
  
  this_00 = (InputUnshared *)operator_new(0xf8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,attributeData->semantic,&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,attributeData->source,&local_5a);
  InputUnshared::InputUnshared(this_00,&local_38,&local_58);
  this->mCurrentVertexInput = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool SplineLoader::begin__input____InputLocal( const input____InputLocal__AttributeData& attributeData )
	{
		mCurrentVertexInput = new InputUnshared(attributeData.semantic, attributeData.source);
		return true;
	}